

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O2

int mask_contains(uint32_t *a,uint32_t *b,int size)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (long)(size + 0x1f) / 0x20;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      return 1;
    }
    puVar1 = a + uVar5;
    puVar2 = b + uVar5;
    uVar5 = uVar5 + 1;
  } while ((*puVar2 & ~*puVar1) == 0);
  return 0;
}

Assistant:

int mask_contains(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if ((a[i] & b[i]) != b[i]) {
			return 0;
		}
	return 1;
}